

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_fchang_2003.h
# Opt level: O2

Point2i __thiscall
CT::MemTracer(CT *this,MemMat<unsigned_char> *img,MemMat<int> *img_labels,Point2i *p,int *i_prev,
             bool *b_isolated)

{
  ulong uVar1;
  uchar *puVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int c;
  undefined1 *in_stack_00000008;
  
  uVar1 = (long)(*(int *)b_isolated + 2) % 8;
  iVar4 = (int)uVar1;
  c = 0;
  iVar5 = 0;
  do {
    switch(uVar1 & 0xffffffff) {
    case 0:
      iVar5 = i_prev[1];
      c = *i_prev + 1;
      break;
    case 1:
      iVar5 = i_prev[1];
      c = *i_prev + 1;
      goto LAB_0017f19e;
    case 2:
      c = *i_prev;
      iVar5 = i_prev[1];
      goto LAB_0017f19e;
    case 3:
      iVar5 = i_prev[1];
      c = *i_prev + -1;
LAB_0017f19e:
      iVar5 = iVar5 + 1;
      break;
    case 4:
      iVar5 = i_prev[1];
      c = *i_prev + -1;
      break;
    case 5:
      iVar5 = i_prev[1];
      c = *i_prev + -1;
      goto LAB_0017f1bb;
    case 6:
      c = *i_prev;
      iVar5 = i_prev[1];
      goto LAB_0017f1bb;
    case 7:
      iVar5 = i_prev[1];
      c = *i_prev + 1;
LAB_0017f1bb:
      iVar5 = iVar5 + -1;
    }
    if ((((-1 < iVar5) && (-1 < c)) && (iVar5 < img_labels->rows)) && (c < img_labels->cols)) {
      puVar2 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)img_labels,iVar5,c);
      if (*puVar2 == (img->accesses_).field_0xc) {
        *(int *)b_isolated = ((int)uVar1 + 4) % 8;
        *(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling._vptr_Labeling =
             c;
        *(int *)((long)&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.
                        _vptr_Labeling + 4) = iVar5;
        return (Point2i)this;
      }
      piVar3 = MemMat<int>::operator()((MemMat<int> *)p,iVar5,c);
      *piVar3 = -1;
    }
    uVar1 = (long)((int)uVar1 + 1) % 8;
    if ((int)uVar1 == iVar4) {
      *in_stack_00000008 = 1;
      (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling._vptr_Labeling =
           *(_func_int ***)i_prev;
      return (Point2i)this;
    }
  } while( true );
}

Assistant:

cv::Point2i MemTracer(MemMat<unsigned char> &img, MemMat<int> &img_labels, const cv::Point2i &p, int &i_prev, bool &b_isolated) {
        int i_first, i_next;

        // Find the direction to be analyzed
        i_first = i_next = (i_prev + 2) % 8;

        cv::Point2i crd_next;
        do {
            switch (i_next) {
            case 0: crd_next = p + cv::Point2i(1, 0); break;
            case 1: crd_next = p + cv::Point2i(1, 1); break;
            case 2: crd_next = p + cv::Point2i(0, 1); break;
            case 3: crd_next = p + cv::Point2i(-1, 1); break;
            case 4: crd_next = p + cv::Point2i(-1, 0); break;
            case 5: crd_next = p + cv::Point2i(-1, -1); break;
            case 6: crd_next = p + cv::Point2i(0, -1); break;
            case 7: crd_next = p + cv::Point2i(1, -1); break;
            }

            if (crd_next.y >= 0 && crd_next.x >= 0 && crd_next.y < img.rows && crd_next.x < img.cols) {
                if (img(crd_next.y, crd_next.x) == byF) {
                    i_prev = (i_next + 4) % 8;
                    return crd_next;
                }
                else
                    img_labels(crd_next.y, crd_next.x) = -1;
            }

            i_next = (i_next + 1) % 8;
        } while (i_next != i_first);

        b_isolated = true;
        return p;
    }